

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20250127::container_internal::SetCtrl
               (CommonFields *c,size_t i,h2_t h,size_t slot_size)

{
  ulong uVar1;
  ctrl_t *pcVar2;
  
  uVar1 = c->capacity_;
  if (i < uVar1) {
    pcVar2 = (c->heap_or_soo_).heap.control;
    pcVar2[i] = h;
    pcVar2[(ulong)((uint)uVar1 & 0xf) + (i - 0xf & uVar1)] = h;
    return;
  }
  __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x744,
                "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
               );
}

Assistant:

size_t capacity() const { return capacity_; }